

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestConsole.cpp
# Opt level: O2

void testConsole(void)

{
  char buffer [20000];
  
  Console::printf("%s\n","Hello world");
  Memory::fill(buffer,'a',0x4e1e);
  buffer[0x4e1d] = 'b';
  buffer[0x4e1e] = '\0';
  Console::printf("%hs%hs\n",buffer,buffer);
  return;
}

Assistant:

void testConsole()
{
  // test printf
  {
    Console::printf("%s\n", "Hello world");
    char buffer[5000 * 4];
    usize bufferSize = sizeof(buffer) - 1;
    Memory::fill(buffer, 'a', bufferSize - 1);
    buffer[bufferSize - 2] = 'b';
    buffer[bufferSize - 1] = '\0';
    Console::printf("%hs%hs\n", buffer, buffer);
  }
}